

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O0

void __thiscall ui::anon_unknown_1::MainMenu::~MainMenu(MainMenu *this)

{
  MainMenu *this_local;
  
  (this->super_ComponentBase)._vptr_ComponentBase = (_func_int **)&PTR__MainMenu_00218d58;
  std::shared_ptr<ftxui::ComponentBase>::~shared_ptr(&this->resizeable_split_);
  std::shared_ptr<ftxui::ComponentBase>::~shared_ptr(&this->exit_button_);
  std::shared_ptr<ftxui::ComponentBase>::~shared_ptr(&this->group_tab_);
  std::shared_ptr<ftxui::ComponentBase>::~shared_ptr(&this->group_menu_);
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::~vector(&this->tab_);
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::~vector(&this->menu_);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&this->menu_entries_);
  std::vector<int,_std::allocator<int>_>::~vector(&this->index_);
  ftxui::ComponentBase::~ComponentBase(&this->super_ComponentBase);
  return;
}

Assistant:

MainMenu(std::vector<Group> menu_group, ScreenInteractive* screen) {
    // The sub menu:
    index_.resize(menu_group.size());
    menu_entries_.resize(menu_group.size());
    menu_.resize(menu_group.size());
    tab_.resize(menu_group.size());

    MenuOption menu_option;
    menu_option.style_selected =
        bold | color(Color::Chartreuse1) | bgcolor(Color::Black);
    menu_option.style_focused =
        color(Color::Black) | bgcolor(Color::Chartreuse1);
    menu_option.style_selected_focused =
        bold | color(Color::Black) | bgcolor(Color::Chartreuse1);

    for (size_t i = 0; i < menu_group.size(); ++i) {
      menu_[i] = Menu(&menu_entries_[i], &index_[i], menu_option);
      tab_[i] = Container::Tab({}, &index_[i]);
      index_[i] = 0;
      for (auto it : menu_group[i].groups) {
        menu_entries_[i].push_back(it->Title());
        tab_[i]->Add(Make<PanelAdapter>(std::move(it)));
      }

      menu_[i] = Header(menu_group[i].title, menu_[i]);
    }

    // The global menu.
    group_menu_ = Container::Vertical(menu_, &group_index_);
    group_tab_ = Container::Tab(tab_, &group_index_);

    ButtonOption exitButtonOption;
    exitButtonOption.border = false;
    exit_button_ =
        Button("[Exit]", screen->ExitLoopClosure(), exitButtonOption);

    auto left_container = Container::Vertical({
        exit_button_,
        group_menu_,
    });

    auto menu_renderer = Renderer(left_container, [&] {
      return vbox({
          hbox({
              spinner(5, iteration_),
              text("  beagle-config"),
              filler(),
              exit_button_->Render() | color(Color::DarkOrange3),
          }),
          group_menu_->Render() | yframe,
      });
    });

    auto content_renderer =
        Renderer(group_tab_, [&] { return group_tab_->Render() | flex; });

    resizeable_split_ =
        ResizableSplitLeft(menu_renderer, content_renderer, &menu_width_);

    Add(resizeable_split_);
  }